

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::read_any
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  uint16_t *extent_index_00;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_180;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_e0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e0,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  bVar2 = read_number(this,(Ptr *)&local_e0,false,p,write_index,extent_index,write);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
  bVar3 = true;
  if (!bVar2) {
    if (this->err == false) {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_f0,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      bVar2 = read_timestamp(this,(Ptr *)&local_f0,false,p,write_index,extent_index,write);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
      if (bVar2) {
        return true;
      }
      if (this->err == false) {
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_100,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        bVar2 = read_string(this,(Ptr *)&local_100,false,p,write_index,extent_index,write);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
        if (bVar2) {
          return true;
        }
        if (this->err == false) {
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_110,
                     &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
          bVar2 = read_boolean(this,(Ptr *)&local_110,false,p,write_index,extent_index,write);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
          if (bVar2) {
            return true;
          }
          if (this->err == false) {
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_120,
                       &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
            bVar2 = read_function(this,(Ptr *)&local_120,false,p,write_index,extent_index,write);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount)
            ;
            if (bVar2) {
              return true;
            }
            if (this->err == false) {
              std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_130,
                         &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
              ;
              bVar2 = read_node(this,(Ptr *)&local_130,false,p,write_index,extent_index,write);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_130._M_refcount);
              if (bVar2) {
                return true;
              }
              if (this->err == false) {
                std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_140,
                           &node->
                            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
                extent_index_00 = extent_index;
                bVar2 = read_device(this,(Ptr *)&local_140,false,p,write_index,extent_index,write);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_140._M_refcount);
                if (bVar2) {
                  return true;
                }
                if (this->err == false) {
                  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            (&local_150,
                             &node->
                              super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
                  bVar2 = read_class(this,(Ptr *)&local_150,false,p,write_index,extent_index_00,
                                     write);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_150._M_refcount);
                  if (bVar2) {
                    return true;
                  }
                  if (this->err == false) {
                    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                              (&local_160,
                               &node->
                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
                    ;
                    bVar2 = read_expression(this,(Ptr *)&local_160,false,(Class *)0x0,write_index,
                                            extent_index,write);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&local_160._M_refcount);
                    if (bVar2) {
                      return true;
                    }
                    if (this->err == false) {
                      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr(&local_170,
                                   &node->
                                    super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                  );
                      bVar2 = read_set(this,(Ptr *)&local_170,false,(Class *)0x0,write_index,
                                       extent_index,write);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&local_170._M_refcount);
                      if (!write || bVar2) {
                        return bVar2;
                      }
                      std::operator+(&local_50,"error: expecting more elements in ",
                                     &((node->
                                       super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->cmd);
                      std::operator+(&local_b0,&local_50,", has ");
                      peVar1 = (node->
                               super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr;
                      std::__cxx11::to_string
                                (&local_d0,
                                 (long)(peVar1->args).
                                       super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(peVar1->args).
                                       super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4);
                      std::operator+(&local_90,&local_b0,&local_d0);
                      std::operator+(&local_70,&local_90," arguments");
                      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr(&local_180,
                                   &node->
                                    super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                  );
                      set_error(this,&local_70,(Ptr *)&local_180);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&local_180._M_refcount);
                      std::__cxx11::string::~string((string *)&local_70);
                      std::__cxx11::string::~string((string *)&local_90);
                      std::__cxx11::string::~string((string *)&local_d0);
                      std::__cxx11::string::~string((string *)&local_b0);
                      std::__cxx11::string::~string((string *)&local_50);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Compiler::read_any(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)   // enforce always false, p always NULL.
{
    if (read_number(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_timestamp(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_string(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_boolean(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_function(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_node(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_device(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_class(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_expression(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (err) {
        return false;
    }

    if (read_set(node, false, nullptr, write_index, extent_index, write)) {
        return true;
    }

    if (write) {
        set_error("error: expecting more elements in " + node->cmd + ", has " + std::to_string(node->args.size()) + " arguments", node);
    }

    return false;
}